

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void rw::wdgl::packattrib(uint8 *dst,float32 *src,AttribDesc *a,float32 scale)

{
  int local_50;
  int local_4c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int16 *i16dst;
  uint16 *u16dst;
  int8 *i8dst;
  float32 scale_local;
  AttribDesc *a_local;
  float32 *src_local;
  uint8 *dst_local;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)(a->size << 2));
    break;
  case 1:
    for (i_2 = 0; i_2 < a->size; i_2 = i_2 + 1) {
      if (a->normalized == 0) {
        dst[i_2] = (uint8)(int)((float)src[i_2] * (float)scale);
      }
      else {
        dst[i_2] = (uint8)(int)((float)src[i_2] * 127.0);
      }
    }
    break;
  case 2:
    for (i_3 = 0; i_3 < a->size; i_3 = i_3 + 1) {
      if (a->normalized == 0) {
        dst[i_3] = (uint8)(int)((float)src[i_3] * (float)scale);
      }
      else {
        dst[i_3] = (uint8)(int)((float)src[i_3] * 255.0);
      }
    }
    break;
  case 3:
    for (local_4c = 0; local_4c < a->size; local_4c = local_4c + 1) {
      if (a->normalized == 0) {
        *(short *)(dst + (long)local_4c * 2) = (short)(int)((float)src[local_4c] * (float)scale);
      }
      else {
        *(short *)(dst + (long)local_4c * 2) = (short)(int)((float)src[local_4c] * 32767.0);
      }
    }
    break;
  case 4:
    for (local_50 = 0; local_50 < a->size; local_50 = local_50 + 1) {
      if (a->normalized == 0) {
        *(short *)(dst + (long)local_50 * 2) = (short)(int)((float)src[local_50] * (float)scale);
      }
      else {
        *(short *)(dst + (long)local_50 * 2) = (short)(int)((float)src[local_50] * 65535.0);
      }
    }
  }
  return;
}

Assistant:

void
packattrib(uint8 *dst, float32 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8dst;
	uint16 *u16dst;
	int16 *i16dst;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8dst = (int8*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i8dst[i] = src[i]*scale;
			else
				i8dst[i] = src[i]*127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]*scale;
			else
				dst[i] = src[i]*255.0f;
		}
		break;

	case 3: // short
		i16dst = (int16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i16dst[i] = src[i]*scale;
			else
				i16dst[i] = src[i]*32767.0f;
		}
		break;

	case 4: // ushort
		u16dst = (uint16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				u16dst[i] = src[i]*scale;
			else
				u16dst[i] = src[i]*65535.0f;
		}
		break;
	}
}